

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

TlbExportVisitor * __thiscall
(anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(TlbExportVisitor *this)

{
  ulong uVar1;
  long in_RSI;
  anon_unknown_dwarf_39db local_58 [32];
  string local_38 [40];
  TlbExportVisitor *this_local;
  
  this_local = (TlbExportVisitor *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    anon_unknown.dwarf_39db::xmlEscape(local_58,(string *)(in_RSI + 0x30));
    std::operator+((char *)local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "source_id=\"");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    std::__cxx11::string::string((string *)this);
  }
  return this;
}

Assistant:

std::string TlbExportVisitor::emitSourceID() const
    {
        if (!m_source_id.empty())
            return "source_id=\"" + xmlEscape(m_source_id) + "\"";
        else return std::string();
    }